

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O3

void __thiscall
CNscContext::AddStructure
          (CNscContext *this,char *pszIdentifier,uchar *pauchStructData,size_t nStructDataSize)

{
  CNscSymbolTable *this_00;
  size_t *psVar1;
  uint uVar2;
  size_t sVar3;
  uchar *puVar4;
  size_t sVar5;
  iterator __position;
  int iVar6;
  NscSymbol *pNVar7;
  int iVar8;
  int iVar9;
  unsigned_long uVar10;
  NscPCodeHeader *p;
  long *plVar11;
  size_t nSymbol;
  unsigned_long local_38;
  
  uVar2 = this->m_nStructs;
  if (0x7f < (int)uVar2) {
    GenerateMessage(this,NscMessage_ErrorTooManyStructures,(ulong)uVar2);
    return;
  }
  this_00 = &this->m_sSymbols;
  pNVar7 = CNscSymbolTable::Add(this_00,pszIdentifier,NscSymType_Structure);
  (pNVar7->field_6).field_0.nToken = uVar2 + 0x20;
  iVar8 = 0;
  (pNVar7->field_6).field_0.nEngineObject = 0;
  (pNVar7->field_6).field_2.nStackOffset = 0;
  uVar10 = (long)pNVar7 - (long)(this->m_sSymbols).m_pauchData;
  iVar9 = 0;
  local_38 = uVar10;
  if (0 < (long)nStructDataSize) {
    iVar9 = 0;
    iVar8 = 0;
    plVar11 = (long *)pauchStructData;
    do {
      iVar9 = iVar9 + 1;
      iVar6 = GetTypeSize(this,*(NscType *)((long)plVar11 + 0xc));
      iVar8 = iVar8 + iVar6;
      plVar11 = (long *)((long)plVar11 + *plVar11);
    } while (plVar11 < pauchStructData + nStructDataSize);
  }
  sVar3 = (this->m_sSymbols).m_nSize;
  CNscSymbolTable::MakeRoom(this_00,8);
  puVar4 = (this->m_sSymbols).m_pauchData;
  sVar5 = (this->m_sSymbols).m_nSize;
  *(int *)(puVar4 + sVar5) = iVar9;
  *(int *)(puVar4 + sVar5 + 4) = iVar8;
  psVar1 = &(this->m_sSymbols).m_nSize;
  *psVar1 = *psVar1 + 8;
  CNscSymbolTable::MakeRoom(this_00,nStructDataSize);
  memcpy((this->m_sSymbols).m_pauchData + (this->m_sSymbols).m_nSize,pauchStructData,nStructDataSize
        );
  psVar1 = &(this->m_sSymbols).m_nSize;
  *psVar1 = *psVar1 + nStructDataSize;
  puVar4 = (this->m_sSymbols).m_pauchData;
  *(size_t *)(puVar4 + uVar10 + 0x28) = sVar3;
  pNVar7 = (NscSymbol *)(puVar4 + uVar10);
  iVar8 = -2;
  if ((this->m_fCompilingIntrinsic == false) && (iVar8 = -1, this->m_fNWScript == false)) {
    iVar8 = this->m_pStreamTop->nFile;
  }
  pNVar7->nFile = iVar8;
  pNVar7->nLine = this->m_pStreamTop->nLine;
  iVar8 = this->m_nStructs;
  this->m_nStructs = iVar8 + 1;
  this->m_anStructSymbol[iVar8] = uVar10;
  __position._M_current =
       (this->m_anGlobalDefs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_anGlobalDefs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_anGlobalDefs,
               __position,&local_38);
  }
  else {
    *__position._M_current = uVar10;
    (this->m_anGlobalDefs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  MarkGlobalIdentifierSymbol(this,pNVar7);
  return;
}

Assistant:

void CNscContext::AddStructure (const char *pszIdentifier, 
	unsigned char *pauchStructData, size_t nStructDataSize)
{

	//
	// Make sure we still have room
	//

	if (m_nStructs >= Max_Structs)
	{
		GenerateMessage (NscMessage_ErrorTooManyStructures, m_nStructs);
		return;
	}

	//
	// Add a new symbol
	//

	NscType nType = (NscType) (NscType_Struct_0 + m_nStructs);
	NscSymbol *pSymbol = m_sSymbols .Add (
		pszIdentifier, NscSymType_Structure);
	pSymbol ->nType = nType;
	pSymbol ->ulFlags = 0;
	pSymbol ->nStackOffset = 0;
	size_t nSymbol = m_sSymbols .GetSymbolOffset (pSymbol);

	//
	// Count the number of elements
	//

	NscSymbolStructExtra sExtra;
	sExtra .nElementCount = 0;
	sExtra .nTotalSize = 0;
	unsigned char *pauchData = pauchStructData;
	unsigned char *pauchEnd = &pauchData [nStructDataSize];
	while (pauchData < pauchEnd)
	{
		NscPCodeHeader *p = (NscPCodeHeader *) pauchData;
		sExtra .nElementCount++;
		sExtra .nTotalSize += GetTypeSize (p ->nType);
		pauchData += p ->nOpSize;
	}

	//
	// Add the symbol data
	//

	size_t nExtra = m_sSymbols .AppendData (&sExtra, sizeof (sExtra));
	m_sSymbols .AppendData (pauchStructData, nStructDataSize);

	//
	// Save the data
	//

	pSymbol = m_sSymbols .GetSymbol (nSymbol);
	pSymbol ->nExtra = nExtra;
	pSymbol ->nFile = GetCurrentSourceFile ();
	pSymbol ->nLine = GetCurrentLine ();

	//
	// Save the symbol offset
	//

	m_anStructSymbol [m_nStructs++] = nSymbol;
	m_anGlobalDefs .push_back (nSymbol);
	MarkGlobalIdentifierSymbol (pSymbol);
}